

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_quad_to_line<charls::transform_hp2<unsigned_short>,unsigned_short>
               (quad<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp2<unsigned_short> *transform,uint32_t mask)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  if (pixel_stride_in != 0) {
    sVar5 = 0;
    do {
      uVar4 = source[sVar5].super_triplet<unsigned_short>.field_0.v1 & mask;
      uVar6 = source[sVar5].super_triplet<unsigned_short>.field_1.v2 & mask;
      uVar1 = source[sVar5].super_triplet<unsigned_short>.field_2.v3;
      uVar3 = (unsigned_short)uVar6;
      uVar2 = source[sVar5].field_0.v4;
      destination[sVar5] = (short)uVar4 - uVar3 ^ 0x8000;
      destination[pixel_stride + sVar5] = uVar3;
      destination[pixel_stride * 2 + sVar5] =
           (uVar1 & (ushort)mask) - (short)(uVar6 + uVar4 >> 1) ^ 0x8000;
      destination[pixel_stride * 3 + sVar5] = uVar2 & (ushort)mask;
      sVar5 = sVar5 + 1;
    } while (pixel_stride_in != sVar5);
  }
  return;
}

Assistant:

void transform_quad_to_line(const quad<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                            const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> color{source[i]};
        const quad<PixelType> color_transformed(transform(color.v1 & mask, color.v2 & mask, color.v3 & mask),
                                                color.v4 & mask);

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
        destination[i + 3 * pixel_stride] = color_transformed.v4;
    }
}